

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O1

void __thiscall sago::PlatformFolders::PlatformFolders(PlatformFolders *this)

{
  _Rb_tree_node_base *this_00;
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar7;
  mapped_type *pmVar8;
  long *plVar9;
  istream *piVar10;
  long lVar11;
  undefined8 *puVar12;
  _Base_ptr p_Var13;
  long *plVar14;
  ulong uVar15;
  undefined8 uVar16;
  bool bVar17;
  size_type __dnew;
  string key;
  ifstream infile;
  char *local_310;
  long local_308;
  char local_300;
  undefined7 uStack_2ff;
  key_type local_2f0;
  PlatformFolders *local_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2a8;
  _Base_ptr local_2a0;
  long *local_298 [2];
  long local_288 [2];
  string local_278;
  long *local_258 [2];
  long local_248 [2];
  key_type local_238 [16];
  
  pmVar7 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)operator_new(0x30);
  local_2a0 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pmVar7->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_2a0;
  (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_2a0;
  (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->data = (PlatformFoldersData *)pmVar7;
  paVar2 = &local_238[0].field_2;
  local_310 = (char *)0x11;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_310);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_310,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_310 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_310 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_310 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_DOCUMENTS_DIR",0x11);
  local_238[0]._M_string_length = (size_type)local_310;
  local_238[0]._M_dataplus._M_p[(long)local_310] = '\0';
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x107211);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_238[0].field_2._M_allocated_capacity._0_5_ = 0x445f474458;
  local_238[0].field_2._M_local_buf[5] = 'E';
  local_238[0].field_2._M_local_buf[6] = 'S';
  local_238[0].field_2._M_local_buf[7] = 'K';
  local_238[0].field_2._8_5_ = 0x445f504f54;
  local_238[0].field_2._M_local_buf[0xd] = 'I';
  local_238[0].field_2._M_local_buf[0xe] = 'R';
  local_238[0]._M_string_length = 0xf;
  local_238[0].field_2._M_local_buf[0xf] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x107221);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_310 = (char *)0x10;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_310);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_310,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_310 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_310 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_310 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_DOWNLOAD_DIR",0x10);
  local_238[0]._M_string_length = (size_type)local_310;
  local_238[0]._M_dataplus._M_p[(long)local_310] = '\0';
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x10722f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_238[0].field_2._M_allocated_capacity._0_5_ = 0x4d5f474458;
  local_238[0].field_2._M_local_buf[5] = 'U';
  local_238[0].field_2._M_local_buf[6] = 'S';
  local_238[0].field_2._M_local_buf[7] = 'I';
  local_238[0].field_2._8_5_ = 0x5249445f43;
  local_238[0]._M_string_length = 0xd;
  local_238[0].field_2._M_local_buf[0xd] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x10723f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_310 = (char *)0x10;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_310);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_310,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_310 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_310 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_310 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_PICTURES_DIR",0x10);
  local_238[0]._M_string_length = (size_type)local_310;
  local_238[0]._M_dataplus._M_p[(long)local_310] = '\0';
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x10724b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_310 = (char *)0x13;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_310);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_310,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_310 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_310 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_310 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_PUBLICSHARE_DIR",0x13);
  local_238[0]._M_string_length = (size_type)local_310;
  local_238[0]._M_dataplus._M_p[(long)local_310] = '\0';
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x10725a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_310 = (char *)0x11;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_310);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_310,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_310 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_310 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_310 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_TEMPLATES_DIR",0x11);
  local_238[0]._M_string_length = (size_type)local_310;
  local_238[0]._M_dataplus._M_p[(long)local_310] = '\0';
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x107267);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_238[0].field_2._M_allocated_capacity._0_5_ = 0x565f474458;
  local_238[0].field_2._M_local_buf[5] = 'I';
  local_238[0].field_2._M_local_buf[6] = 'D';
  local_238[0].field_2._M_local_buf[7] = 'E';
  local_238[0].field_2._8_5_ = 0x49445f534f;
  local_238[0].field_2._M_local_buf[0xd] = 'R';
  local_238[0]._M_string_length = 0xe;
  local_238[0].field_2._M_local_buf[0xe] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar7,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x10728a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  getLinuxFolderDefault_abi_cxx11_(&local_278,"XDG_CONFIG_HOME",".config");
  local_2d0 = this;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_2c8 = &local_2b8;
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_2b8 = *plVar14;
    lStack_2b0 = plVar9[3];
  }
  else {
    local_2b8 = *plVar14;
    local_2c8 = (long *)*plVar9;
  }
  local_2c0 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_2a8 = pmVar7;
  std::ifstream::ifstream(local_238,(char *)local_2c8,_S_in);
  local_310 = &local_300;
  local_308 = 0;
  local_300 = '\0';
  while( true ) {
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_dataplus._M_p + -0x18) +
                            (char)local_238);
    piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_238,(string *)&local_310,cVar5);
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
    bVar17 = true;
    if ((local_308 == 0) || (*local_310 == '#')) {
      bVar4 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_258,(ulong)&local_310);
      iVar6 = std::__cxx11::string::compare((char *)local_258);
      bVar4 = true;
      if (iVar6 == 0) {
        lVar11 = std::__cxx11::string::find((char *)&local_310,0x107186,0);
        bVar17 = lVar11 == -1;
      }
      else {
        bVar17 = true;
      }
    }
    if ((bVar4) && (local_258[0] != local_248)) {
      operator_delete(local_258[0],local_248[0] + 1);
    }
    if (!bVar17) {
      cVar5 = (char)(string *)&local_310;
      std::__cxx11::string::find(cVar5,0x3d);
      std::__cxx11::string::substr((ulong)&local_2f0,(ulong)&local_310);
      std::__cxx11::string::find(cVar5,0x22);
      std::__cxx11::string::find(cVar5,0x22);
      std::__cxx11::string::substr((ulong)local_298,(ulong)&local_310);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_2a8,&local_2f0);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if (local_298[0] != local_288) {
        operator_delete(local_298[0],local_288[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,CONCAT71(uStack_2ff,local_300) + 1);
  }
  std::ifstream::~ifstream(local_238);
  pmVar7 = local_2a8;
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  p_Var13 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var13 != local_2a0) {
    do {
      this_00 = p_Var13 + 2;
      iVar6 = std::__cxx11::string::compare((ulong)this_00,0,(char *)0x5);
      if (iVar6 == 0) {
        internal::getHome_abi_cxx11_();
        std::__cxx11::string::substr((ulong)&local_2f0,(ulong)this_00);
        uVar15 = 0xf;
        if (local_310 != &local_300) {
          uVar15 = CONCAT71(uStack_2ff,local_300);
        }
        if (uVar15 < local_2f0._M_string_length + local_308) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            uVar16 = local_2f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_2f0._M_string_length + local_308) goto LAB_001055d0;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_310);
        }
        else {
LAB_001055d0:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_310,(ulong)local_2f0._M_dataplus._M_p);
        }
        local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
        puVar1 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar1) {
          uVar16 = *puVar1;
          uVar3 = puVar12[3];
          local_238[0].field_2._M_allocated_capacity._0_5_ = (undefined5)uVar16;
          local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)uVar16 >> 0x28);
          local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)uVar16 >> 0x30);
          local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)uVar16 >> 0x38);
          local_238[0].field_2._8_5_ = (undefined5)uVar3;
          local_238[0].field_2._M_local_buf[0xd] = (undefined1)((ulong)uVar3 >> 0x28);
          local_238[0].field_2._M_local_buf[0xe] = (undefined1)((ulong)uVar3 >> 0x30);
          local_238[0].field_2._M_local_buf[0xf] = (undefined1)((ulong)uVar3 >> 0x38);
        }
        else {
          uVar16 = *puVar1;
          local_238[0].field_2._M_allocated_capacity._0_5_ = (undefined5)uVar16;
          local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)uVar16 >> 0x28);
          local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)uVar16 >> 0x30);
          local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)uVar16 >> 0x38);
          local_238[0]._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_238[0]._M_string_length = puVar12[1];
        *puVar12 = puVar1;
        puVar12[1] = 0;
        *(undefined1 *)puVar1 = 0;
        std::__cxx11::string::operator=((string *)this_00,(string *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
          operator_delete(local_238[0]._M_dataplus._M_p,
                          CONCAT17(local_238[0].field_2._M_local_buf[7],
                                   CONCAT16(local_238[0].field_2._M_local_buf[6],
                                            CONCAT15(local_238[0].field_2._M_local_buf[5],
                                                     (undefined5)
                                                     local_238[0].field_2._M_allocated_capacity))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if (local_310 != &local_300) {
          operator_delete(local_310,CONCAT71(uStack_2ff,local_300) + 1);
        }
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != local_2a0);
  }
  return;
}

Assistant:

PlatformFolders::PlatformFolders() {
#if !defined(_WIN32) && !defined(__APPLE__)
	this->data = new PlatformFolders::PlatformFoldersData();
	try {
		PlatformFoldersFillData(data->folders);
	}
	catch (...) {
		delete this->data;
		throw;
	}
#endif
}